

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall
kj::Exception::setDetail(Exception *this,DetailTypeId typeId,Array<unsigned_char> *value)

{
  Array<unsigned_char> *pAVar1;
  Detail local_60;
  Detail *local_40;
  Detail *detail;
  Detail *__end1;
  Detail *__begin1;
  Vector<kj::Exception::Detail> *__range1;
  Array<unsigned_char> *value_local;
  DetailTypeId typeId_local;
  Exception *this_local;
  
  __begin1 = (Detail *)&this->details;
  __range1 = (Vector<kj::Exception::Detail> *)value;
  value_local = (Array<unsigned_char> *)typeId;
  typeId_local = (DetailTypeId)this;
  __end1 = Vector<kj::Exception::Detail>::begin((Vector<kj::Exception::Detail> *)__begin1);
  detail = Vector<kj::Exception::Detail>::end((Vector<kj::Exception::Detail> *)__begin1);
  while( true ) {
    if (__end1 == detail) {
      local_60.id = (DetailTypeId)value_local;
      pAVar1 = mv<kj::Array<unsigned_char>>(value);
      Array<unsigned_char>::Array(&local_60.value,pAVar1);
      Vector<kj::Exception::Detail>::add<kj::Exception::Detail>(&this->details,&local_60);
      Detail::~Detail(&local_60);
      return;
    }
    local_40 = __end1;
    if ((Array<unsigned_char> *)__end1->id == value_local) break;
    __end1 = __end1 + 1;
  }
  pAVar1 = mv<kj::Array<unsigned_char>>(value);
  Array<unsigned_char>::operator=(&local_40->value,pAVar1);
  return;
}

Assistant:

void Exception::setDetail(DetailTypeId typeId, kj::Array<byte> value) {
  for (auto& detail: details) {
    if (detail.id == typeId) {
      detail.value = kj::mv(value);
      return;
    }
  }
  details.add(Detail {
    .id = typeId,
    .value = kj::mv(value),
  });
}